

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_throw(lua_State *L,TStatus errcode)

{
  global_State *pgVar1;
  StkId pSVar2;
  long lVar3;
  TStatus errcode_00;
  TValue *io2;
  TValue *io1;
  lua_State *mainth;
  global_State *g;
  TStatus errcode_local;
  lua_State *L_local;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    longjmp((__jmp_buf_tag *)L->errorJmp->b,1);
  }
  pgVar1 = L->l_G;
  errcode_00 = luaE_resetthread(L,errcode);
  L->status = errcode_00;
  if ((pgVar1->mainth).l.errorJmp != (lua_longjmp *)0x0) {
    pSVar2 = (pgVar1->mainth).l.top.p;
    (pgVar1->mainth).l.top.p = pSVar2 + 1;
    lVar3 = (L->top).offset;
    (pSVar2->val).value_ = *(Value *)(lVar3 + -0x10);
    (pSVar2->val).tt_ = *(lu_byte *)(lVar3 + -8);
    luaD_throw(&(pgVar1->mainth).l,errcode_00);
  }
  if (pgVar1->panic != (lua_CFunction)0x0) {
    (*pgVar1->panic)(L);
  }
  abort();
}

Assistant:

l_noret luaD_throw (lua_State *L, TStatus errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
    lua_State *mainth = mainthread(g);
    errcode = luaE_resetthread(L, errcode);  /* close all upvalues */
    L->status = errcode;
    if (mainth->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, mainth->top.p++, L->top.p - 1);  /* copy error obj. */
      luaD_throw(mainth, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}